

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_ldm_fillFastTables(ZSTD_matchState_t *ms,void *end)

{
  int iVar1;
  long in_RDI;
  BYTE *iend;
  void *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = *(int *)(in_RDI + 0x118);
  if (iVar1 == 1) {
    ZSTD_fillHashTable((ZSTD_matchState_t *)CONCAT44(1,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffd8,ZSTD_dtlm_fast,0x27d00a);
  }
  else if (iVar1 == 2) {
    ZSTD_fillDoubleHashTable
              ((ZSTD_matchState_t *)CONCAT44(2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
               ZSTD_dtlm_fast,0x27d01f);
  }
  else if (6 < iVar1 - 3U) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7d53,"size_t ZSTD_ldm_fillFastTables(ZSTD_matchState_t *, const void *)");
  }
  return 0;
}

Assistant:

static size_t ZSTD_ldm_fillFastTables(ZSTD_matchState_t* ms,
                                      void const* end)
{
    const BYTE* const iend = (const BYTE*)end;

    switch(ms->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, ZSTD_dtlm_fast, ZSTD_tfp_forCCtx);
        break;

    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, iend, ZSTD_dtlm_fast, ZSTD_tfp_forCCtx);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
    case ZSTD_btlazy2:
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        break;
    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    return 0;
}